

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxdevexpr.hpp
# Opt level: O0

SPxId __thiscall
soplex::
SPxDevexPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::selectEnterSparseCoDim
          (SPxDevexPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *best,
          number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *feastol)

{
  type_conflict5 tVar1;
  char *pcVar2;
  int *piVar3;
  cpp_dec_float<100U,_int,_void> *in_RDX;
  undefined8 extraout_RDX;
  undefined8 uVar4;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 in_RSI;
  cpp_dec_float<100U,_int,_void> *in_RDI;
  int i;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  x;
  int idx;
  int enterIdx;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pen;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *test;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result;
  undefined1 local_2c4 [8];
  int in_stack_fffffffffffffd44;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffd48;
  undefined1 local_274 [80];
  undefined1 local_224 [12];
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffde8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffdf0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffdf8;
  undefined1 local_1d4 [80];
  undefined1 local_184 [80];
  uint local_134;
  undefined1 local_130 [80];
  int local_e0;
  int local_dc;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_d8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_d0;
  undefined8 local_c0;
  DataKey local_b0;
  undefined1 *local_a8;
  undefined1 *local_a0;
  undefined1 *local_98;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_90;
  undefined1 *local_88;
  undefined1 *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_60;
  uint *local_58;
  undefined1 *local_50;
  undefined8 local_48;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_40;
  undefined1 *local_38;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_29;
  cpp_dec_float<100U,_int,_void> *local_28;
  undefined1 *local_20;
  cpp_dec_float<100U,_int,_void> *local_18;
  undefined1 *local_10;
  undefined1 *local_8;
  
  local_c0 = in_RSI;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::test(*(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           **)((in_RDI->data)._M_elems + 4));
  local_d0 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ::get_const_ptr((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              *)0x5d04a1);
  local_d8 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ::get_const_ptr((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              *)0x5d04c1);
  local_dc = -1;
  local_a8 = local_130;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float(in_RDI);
  local_134 = IdxSet::size((IdxSet *)(*(long *)((in_RDI->data)._M_elems + 4) + 0xef0));
  uVar4 = extraout_RDX;
  while (local_134 = local_134 - 1, -1 < (int)local_134) {
    pcVar2 = IdxSet::index((IdxSet *)(*(long *)((in_RDI->data)._M_elems + 4) + 0xef0),
                           (char *)(ulong)local_134,(int)uVar4);
    local_e0 = (int)pcVar2;
    local_40 = local_d0 + local_e0;
    local_38 = local_130;
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=(in_RDI,in_RDX);
    local_20 = local_184;
    local_28 = in_RDX;
    boost::multiprecision::detail::
    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
    ::
    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
              (&local_29,
               (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)in_RDX);
    local_10 = local_184;
    local_18 = local_28;
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float(in_RDI,in_RDX);
    local_8 = local_184;
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::negate(in_RDI);
    tVar1 = boost::multiprecision::operator<
                      ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)in_RDX,
                       (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)0x5d061d);
    if (tVar1) {
      local_98 = local_224;
      local_a0 = local_130;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float(in_RDI,in_RDX);
      local_90 = local_d8 + local_e0;
      local_88 = local_274;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float(in_RDI,in_RDX);
      local_78 = local_2c4;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float(in_RDI,in_RDX);
      devexpr::
      computePrice<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                (in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
      local_68 = local_130;
      local_70 = local_1d4;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=(in_RDI,in_RDX);
      tVar1 = boost::multiprecision::operator>
                        ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)in_RDX,
                         (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)0x5d0733);
      uVar4 = extraout_RDX_00;
      if (tVar1) {
        local_48 = local_c0;
        local_50 = local_130;
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=(in_RDI,in_RDX);
        local_dc = local_e0;
        local_60 = local_d8 + local_e0;
        local_58 = in_RDI[1].data._M_elems + 0xc;
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=(in_RDI,in_RDX);
        uVar4 = extraout_RDX_01;
      }
    }
    else {
      IdxSet::remove((IdxSet *)(*(long *)((in_RDI->data)._M_elems + 4) + 0xef0),
                     (char *)(ulong)local_134);
      piVar3 = DataArray<int>::operator[]
                         ((DataArray<int> *)(*(long *)((in_RDI->data)._M_elems + 4) + 0xf68),
                          local_e0);
      *piVar3 = 0;
      uVar4 = extraout_RDX_02;
    }
  }
  if (local_dc < 0) {
    SPxId::SPxId((SPxId *)0x5d0855);
  }
  else {
    local_b0 = (DataKey)SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ::id(in_stack_fffffffffffffd48,in_stack_fffffffffffffd44);
  }
  return (SPxId)local_b0;
}

Assistant:

SPxId SPxDevexPR<R>::selectEnterSparseCoDim(R& best, R feastol)
{
   const R* test = this->thesolver->test().get_const_ptr();
   const R* pen = this->thesolver->weights.get_const_ptr();
   int enterIdx = -1;
   int idx;
   R x;

   assert(this->thesolver->weights.dim() == this->thesolver->test().dim());

   for(int i = this->thesolver->infeasibilitiesCo.size() - 1; i >= 0; --i)
   {
      idx = this->thesolver->infeasibilitiesCo.index(i);
      x = test[idx];

      if(x < -feastol)
      {
         x = devexpr::computePrice(x, pen[idx], feastol);

         if(x > best)
         {
            best = x;
            enterIdx = idx;
            last = pen[idx];
         }
      }
      else
      {
         this->thesolver->infeasibilitiesCo.remove(i);
         this->thesolver->isInfeasibleCo[idx] = this->NOT_VIOLATED;
      }
   }

   if(enterIdx >= 0)
      return this->thesolver->id(enterIdx);

   return SPxId();
}